

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBGInterface.cpp
# Opt level: O2

void * SBGInterfaceThread(void *pParam)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  
  if ((szSBGInterfacePath[0] == ':') && (iVar3 = atoi(szSBGInterfacePath + 1), 0 < iVar3)) {
    SBGInterfacePseudoRS232Port.DevType = 2;
    do {
      iVar3 = LaunchMultiCliTCPSrv(szSBGInterfacePath + 1,handlesbginterfacecli,(void *)0x0);
      if (iVar3 == 0) goto LAB_0016a5b5;
      puts("Error launching the SBGInterface server.");
      mSleep(4000);
    } while (bExit == 0);
  }
  else {
    bVar1 = false;
    do {
      if (bVar1) {
        iVar3 = handlesbginterface(&SBGInterfacePseudoRS232Port);
        if (iVar3 == 0) goto LAB_0016a59a;
        puts("Connection to a SBGInterface lost.");
        disconnectsbginterface(&SBGInterfacePseudoRS232Port);
        uSleep(20000);
LAB_0016a58c:
        bVar1 = false;
        bVar2 = true;
      }
      else {
        iVar3 = connectsbginterface(&SBGInterfacePseudoRS232Port);
        if (iVar3 != 0) {
          mSleep(1000);
          goto LAB_0016a58c;
        }
        uSleep(20000);
LAB_0016a59a:
        bVar2 = false;
        bVar1 = true;
      }
    } while (bExit == 0);
    if (!bVar2) {
      disconnectsbginterface(&SBGInterfacePseudoRS232Port);
LAB_0016a5b5:
      if (bExit == 0) {
        bExit = 1;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SBGInterfaceThread(void* pParam)
{
	//CHRONO chrono;
	//double dt = 0, t = 0, t0 = 0;
	//struct timeval tv;

	UNREFERENCED_PARAMETER(pParam);

	//EnterCriticalSection(&strtimeCS);
	//sprintf(sbginterfacefilename, LOG_FOLDER"sbginterface_%.64s.txt", strtimeex_fns());
	//LeaveCriticalSection(&strtimeCS);
	//sbginterfacefile = fopen(sbginterfacefilename, "w");
	//if (sbginterfacefile == NULL)
	//{
	//	printf("Unable to create sbginterface file.\n");
	//	if (!bExit) bExit = TRUE; // Unexpected program exit...
	//	return 0;
	//}

	// Try to determine whether it is a server TCP port.
	if ((szSBGInterfacePath[0] == ':')&&(atoi(szSBGInterfacePath+1) > 0))
	{
		SBGInterfacePseudoRS232Port.DevType = TCP_SERVER_TYPE_RS232PORT;
		while (LaunchMultiCliTCPSrv(szSBGInterfacePath+1, handlesbginterfacecli, NULL) != EXIT_SUCCESS)
		{
			printf("Error launching the SBGInterface server.\n");
			mSleep(4000);
			if (bExit) break;
		}
	}
	else
	{
		BOOL bConnected = FALSE;

		//t = 0;

		//StartChrono(&chrono);

		for (;;)
		{
			//uSleep(1000*20);
			//t0 = t;
			//GetTimeElapsedChrono(&chrono, &t);
			//dt = t-t0;

			//printf("SBGInterfaceThread period : %f s.\n", dt);

			if (!bConnected)
			{
				if (connectsbginterface(&SBGInterfacePseudoRS232Port) == EXIT_SUCCESS) 
				{
					uSleep(1000*20);
					bConnected = TRUE; 

					inithandlesbginterface(&SBGInterfacePseudoRS232Port);
				}
				else 
				{
					bConnected = FALSE;
					mSleep(1000);
				}
			}
			else
			{
				//// Time...
				//if (gettimeofday(&tv, NULL) != EXIT_SUCCESS)
				//{
				//	tv.tv_sec = 0;
				//	tv.tv_usec = 0;
				//}

				if (handlesbginterface(&SBGInterfacePseudoRS232Port) != EXIT_SUCCESS)
				{
					printf("Connection to a SBGInterface lost.\n");
					bConnected = FALSE;
					disconnectsbginterface(&SBGInterfacePseudoRS232Port);
					uSleep(1000*20);
				}
			}

			if (bExit) break;
		}

		//StopChrono(&chrono, &t);

		if (bConnected) disconnectsbginterface(&SBGInterfacePseudoRS232Port);
	}

	//fclose(sbginterfacefile);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}